

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O1

Gia_Man_t *
Gia_ManIsoReduce2(Gia_Man_t *pGia,Vec_Ptr_t **pvPosEquivs,Vec_Ptr_t **pvPiPerms,int fEstimate,
                 int fBetterQual,int fDualOut,int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  int iVar2;
  Vec_Wec_t *vEquivs;
  Vec_Wec_t *__ptr;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  void **__ptr_00;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  Vec_Ptr_t **ppVVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  timespec local_60;
  Vec_Ptr_t *local_50;
  Vec_Wec_t *local_48;
  Vec_Ptr_t **local_40;
  Gia_Man_t *local_38;
  
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  local_50 = (Vec_Ptr_t *)pvPiPerms;
  vEquivs = Gia_Iso2ManPerform(pGia,fVeryVerbose);
  lVar7 = (long)vEquivs->nSize;
  if (lVar7 < 1) {
    uVar12 = 0;
    uVar14 = 0;
  }
  else {
    lVar15 = 0;
    uVar12 = 0;
    uVar14 = 0;
    do {
      iVar2 = *(int *)((long)&vEquivs->pArray->nSize + lVar15);
      bVar1 = 1 < iVar2;
      if (iVar2 < 2) {
        iVar2 = 0;
      }
      uVar12 = (ulong)(uint)((int)uVar12 + iVar2);
      uVar14 = (ulong)((int)uVar14 + (uint)bVar1);
      lVar15 = lVar15 + 0x10;
    } while (lVar7 << 4 != lVar15);
  }
  printf("Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  "
         ,(ulong)(uint)(pGia->vCos->nSize - pGia->nRegs),lVar7,uVar12,uVar14);
  iVar13 = 3;
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  Abc_Print(iVar13,"%s =","Time");
  Abc_Print(iVar13,"%9.2f sec\n",(double)(lVar7 - lVar11) / 1000000.0);
  if (fEstimate == 0) {
    local_40 = pvPosEquivs;
    if (fBetterQual == 0) {
      __ptr = Gia_Iso2ManCheckIsoClassesSkip(pGia,vEquivs);
    }
    else {
      __ptr = Gia_Iso2ManCheckIsoClasses(pGia,vEquivs);
    }
    iVar2 = vEquivs->nCap;
    if (0 < (long)iVar2) {
      pVVar3 = vEquivs->pArray;
      lVar7 = 0;
      do {
        pvVar6 = *(void **)((long)&pVVar3->pArray + lVar7);
        if (pvVar6 != (void *)0x0) {
          free(pvVar6);
          *(undefined8 *)((long)&pVVar3->pArray + lVar7) = 0;
        }
        lVar7 = lVar7 + 0x10;
      } while ((long)iVar2 * 0x10 != lVar7);
    }
    if (vEquivs->pArray != (Vec_Int_t *)0x0) {
      free(vEquivs->pArray);
      vEquivs->pArray = (Vec_Int_t *)0x0;
    }
    vEquivs->nCap = 0;
    vEquivs->nSize = 0;
    free(vEquivs);
    qsort(__ptr->pArray,(long)__ptr->nSize,0x10,Vec_WecSortCompare3);
    iVar2 = __ptr->nSize;
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    iVar13 = 0x10;
    if (0xe < iVar2 - 1U) {
      iVar13 = iVar2;
    }
    pVVar3->nSize = 0;
    pVVar3->nCap = iVar13;
    if (iVar13 == 0) {
      piVar4 = (int *)0x0;
    }
    else {
      piVar4 = (int *)malloc((long)iVar13 << 2);
    }
    pVVar3->pArray = piVar4;
    if (0 < iVar2) {
      lVar15 = 8;
      lVar7 = 0;
      do {
        if (0 < *(int *)((long)__ptr->pArray + lVar15 + -4)) {
          Vec_IntPush(pVVar3,**(int **)((long)&__ptr->pArray->nCap + lVar15));
        }
        lVar7 = lVar7 + 1;
        lVar15 = lVar15 + 0x10;
      } while (lVar7 < __ptr->nSize);
    }
    piVar4 = pVVar3->pArray;
    uVar12 = 0;
    local_38 = Gia_ManDupCones(pGia,piVar4,pVVar3->nSize,0);
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      pVVar3->pArray = (int *)0x0;
    }
    free(pVVar3);
    lVar7 = (long)__ptr->nSize;
    uVar14 = 0;
    if (0 < lVar7) {
      lVar15 = 0;
      uVar12 = 0;
      uVar14 = 0;
      do {
        iVar2 = *(int *)((long)&__ptr->pArray->nSize + lVar15);
        bVar1 = 1 < iVar2;
        if (iVar2 < 2) {
          iVar2 = 0;
        }
        uVar12 = (ulong)(uint)((int)uVar12 + iVar2);
        uVar14 = (ulong)((int)uVar14 + (uint)bVar1);
        lVar15 = lVar15 + 0x10;
      } while (lVar7 << 4 != lVar15);
    }
    printf("Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  "
           ,(ulong)(uint)(pGia->vCos->nSize - pGia->nRegs),lVar7,uVar12,uVar14);
    iVar13 = 3;
    iVar2 = clock_gettime(3,&local_60);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    Abc_Print(iVar13,"%s =","Time");
    Abc_Print(iVar13,"%9.2f sec\n",(double)(lVar7 - lVar11) / 1000000.0);
    if ((fVerbose != 0) && (puts("Nontrivial classes:"), 0 < __ptr->nSize)) {
      uVar12 = 0;
      do {
        pVVar3 = __ptr->pArray;
        if (pVVar3[uVar12].nSize != 1) {
          printf(" %4d : {",uVar12 & 0xffffffff);
          if (0 < pVVar3[uVar12].nSize) {
            lVar11 = 0;
            do {
              printf(" %d",(ulong)(uint)pVVar3[uVar12].pArray[lVar11]);
              lVar11 = lVar11 + 1;
            } while (lVar11 < pVVar3[uVar12].nSize);
          }
          puts(" }");
        }
        uVar12 = uVar12 + 1;
      } while ((long)uVar12 < (long)__ptr->nSize);
    }
    ppVVar9 = local_40;
    if (local_50 != (Vec_Ptr_t *)0x0) {
      *(Vec_Ptr_t **)local_50 = (Vec_Ptr_t *)0x0;
    }
    if (local_40 != (Vec_Ptr_t **)0x0) {
      uVar8 = __ptr->nSize;
      pVVar5 = (Vec_Ptr_t *)malloc(0x10);
      uVar10 = 8;
      if (6 < uVar8 - 1) {
        uVar10 = uVar8;
      }
      pVVar5->nSize = 0;
      pVVar5->nCap = uVar10;
      if (uVar10 == 0) {
        __ptr_00 = (void **)0x0;
      }
      else {
        __ptr_00 = (void **)malloc((long)(int)uVar10 << 3);
      }
      pVVar5->pArray = __ptr_00;
      if (0 < (int)uVar8) {
        lVar7 = 1;
        lVar11 = 0;
        local_50 = pVVar5;
        local_48 = __ptr;
        do {
          pVVar3 = __ptr->pArray;
          piVar4 = (int *)malloc(0x10);
          iVar2 = *(int *)((long)pVVar3 + lVar7 * 8 + -4);
          lVar15 = (long)iVar2;
          piVar4[1] = iVar2;
          *piVar4 = iVar2;
          if (lVar15 == 0) {
            pvVar6 = (void *)0x0;
          }
          else {
            pvVar6 = malloc(lVar15 * 4);
          }
          *(void **)(piVar4 + 2) = pvVar6;
          memcpy(pvVar6,*(void **)(&pVVar3->nCap + lVar7 * 2),lVar15 << 2);
          __ptr = local_48;
          if ((uint)lVar11 == uVar10) {
            if ((int)uVar10 < 0x10) {
              if (__ptr_00 == (void **)0x0) {
                __ptr_00 = (void **)malloc(0x80);
              }
              else {
                __ptr_00 = (void **)realloc(__ptr_00,0x80);
              }
              uVar10 = 0x10;
            }
            else {
              uVar8 = uVar10 * 2;
              if (SBORROW4(uVar10,uVar8) != 0 < (int)uVar10) {
                uVar10 = uVar8;
                if (__ptr_00 == (void **)0x0) {
                  __ptr_00 = (void **)malloc((ulong)uVar8 << 3);
                }
                else {
                  __ptr_00 = (void **)realloc(__ptr_00,(ulong)uVar8 << 3);
                }
              }
            }
          }
          __ptr_00[lVar11] = piVar4;
          lVar11 = lVar11 + 1;
          lVar7 = lVar7 + 2;
        } while (lVar11 < __ptr->nSize);
        local_50->nSize = (int)lVar11;
        local_50->nCap = uVar10;
        local_50->pArray = __ptr_00;
        ppVVar9 = local_40;
        pVVar5 = local_50;
      }
      *ppVVar9 = pVVar5;
    }
    iVar2 = __ptr->nCap;
    if (0 < (long)iVar2) {
      lVar11 = 0;
      do {
        pvVar6 = *(void **)((long)&__ptr->pArray->pArray + lVar11);
        if (pvVar6 != (void *)0x0) {
          free(pvVar6);
          *(undefined8 *)((long)&__ptr->pArray->pArray + lVar11) = 0;
        }
        lVar11 = lVar11 + 0x10;
      } while ((long)iVar2 * 0x10 != lVar11);
    }
    if (__ptr->pArray != (Vec_Int_t *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (Vec_Int_t *)0x0;
    }
    __ptr->nCap = 0;
    __ptr->nSize = 0;
    free(__ptr);
  }
  else {
    iVar2 = vEquivs->nCap;
    if (0 < (long)iVar2) {
      pVVar3 = vEquivs->pArray;
      lVar11 = 0;
      do {
        pvVar6 = *(void **)((long)&pVVar3->pArray + lVar11);
        if (pvVar6 != (void *)0x0) {
          free(pvVar6);
          *(undefined8 *)((long)&pVVar3->pArray + lVar11) = 0;
        }
        lVar11 = lVar11 + 0x10;
      } while ((long)iVar2 * 0x10 != lVar11);
    }
    if (vEquivs->pArray != (Vec_Int_t *)0x0) {
      free(vEquivs->pArray);
      vEquivs->pArray = (Vec_Int_t *)0x0;
    }
    vEquivs->nCap = 0;
    vEquivs->nSize = 0;
    free(vEquivs);
    local_38 = Gia_ManDup(pGia);
  }
  return local_38;
}

Assistant:

Gia_Man_t * Gia_ManIsoReduce2( Gia_Man_t * pGia, Vec_Ptr_t ** pvPosEquivs, Vec_Ptr_t ** pvPiPerms, int fEstimate, int fBetterQual, int fDualOut, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pPart;
    Vec_Wec_t * vEquivs, * vEquivs2;
    Vec_Int_t * vRemains;
    int nClasses, nUsedPos;
    abctime clk = Abc_Clock();
    vEquivs = Gia_Iso2ManPerform( pGia, fVeryVerbose );
    // report class stats
    nClasses = Vec_WecCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(pGia), Vec_WecSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fEstimate )
    {
        Vec_WecFree( vEquivs );
        return Gia_ManDup(pGia);
    }
    // verify classes
    if ( fBetterQual )
        vEquivs2 = Gia_Iso2ManCheckIsoClasses( pGia, vEquivs );
    else
        vEquivs2 = Gia_Iso2ManCheckIsoClassesSkip( pGia, vEquivs );
    Vec_WecFree( vEquivs );
    vEquivs = vEquivs2;
    // sort equiv classes by the first integer
    Vec_WecSortByFirstInt( vEquivs, 0 );
    // find the first outputs
    vRemains = Vec_WecCollectFirsts( vEquivs );
    // derive the final GIA
    pPart = Gia_ManDupCones( pGia, Vec_IntArray(vRemains), Vec_IntSize(vRemains), 0 );
    Vec_IntFree( vRemains );
    // report class stats
    nClasses = Vec_WecCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(pGia), Vec_WecSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vEquivs, 1 );
    }
    if ( pvPiPerms )
        *pvPiPerms = NULL;
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vEquivs );
    Vec_WecFree( vEquivs );
//    Gia_ManStopP( &pPart );
    return pPart;
}